

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O0

int read_mtree(archive_read *a,mtree *mtree)

{
  int iVar1;
  archive_read *in_RSI;
  mtree *in_RDI;
  int is_form_d;
  int r;
  mtree_entry *last_entry;
  mtree_option *global;
  char *p;
  uintmax_t counter;
  ssize_t len;
  int in_stack_00000060;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  mtree_option **global_00;
  archive_read *a_00;
  char *local_30;
  char *line;
  mtree_option **in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  (in_RSI->archive).archive_error_number = 0x80000;
  (in_RSI->archive).error = "mtree";
  a_00 = (archive_read *)0x0;
  global_00 = (mtree_option **)0x0;
  detect_form((archive_read *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
              (int *)in_RDI);
  line = (char *)0x1;
  do {
    in_stack_ffffffffffffffe0 =
         (mtree_option **)
         readline((archive_read *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                  in_RDI,(char **)in_RSI,(ssize_t)in_stack_ffffffffffffffe0);
    if (in_stack_ffffffffffffffe0 == (mtree_option **)0x0) {
      (in_RSI->archive).error_string.length = (size_t)(in_RSI->archive).error_string.s;
      free_options((mtree_option *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
      return 0;
    }
    if ((long)in_stack_ffffffffffffffe0 < 0) {
      free_options((mtree_option *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
      return (int)in_stack_ffffffffffffffe0;
    }
    while( true ) {
      in_stack_ffffffffffffffb7 = true;
      if (*local_30 != ' ') {
        in_stack_ffffffffffffffb7 = *local_30 == '\t';
      }
      if ((bool)in_stack_ffffffffffffffb7 == false) break;
      local_30 = local_30 + 1;
      in_stack_ffffffffffffffe0 = (mtree_option **)((long)in_stack_ffffffffffffffe0 + -1);
    }
    if ((((*local_30 != '#') && (*local_30 != '\r')) && (*local_30 != '\n')) && (*local_30 != '\0'))
    {
      if (*local_30 == '/') {
        iVar1 = strncmp(local_30,"/set",4);
        if (iVar1 == 0) {
          if ((local_30[4] != ' ') && (local_30[4] != '\t')) {
LAB_0014860f:
            archive_set_error((archive *)in_RDI,0x54,"Can\'t parse line %ju",line);
            free_options((mtree_option *)
                         CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
            return -0x1e;
          }
          iVar1 = process_global_set(in_RSI,in_stack_ffffffffffffffe0,line);
        }
        else {
          iVar1 = strncmp(local_30,"/unset",6);
          if ((iVar1 != 0) || ((local_30[6] != ' ' && (local_30[6] != '\t')))) goto LAB_0014860f;
          iVar1 = process_global_unset
                            (a_00,global_00,
                             (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
        }
      }
      else {
        iVar1 = process_add_entry(a,mtree,(mtree_option **)len,(char *)counter,(ssize_t)p,
                                  (mtree_entry **)global,in_stack_00000060);
      }
      if (iVar1 != 0) {
        free_options((mtree_option *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
        return iVar1;
      }
      in_stack_ffffffffffffffbc = 0;
    }
    line = line + 1;
  } while( true );
}

Assistant:

static int
read_mtree(struct archive_read *a, struct mtree *mtree)
{
	ssize_t len;
	uintmax_t counter;
	char *p;
	struct mtree_option *global;
	struct mtree_entry *last_entry;
	int r, is_form_d;

	mtree->archive_format = ARCHIVE_FORMAT_MTREE;
	mtree->archive_format_name = "mtree";

	global = NULL;
	last_entry = NULL;

	(void)detect_form(a, &is_form_d);

	for (counter = 1; ; ++counter) {
		len = readline(a, mtree, &p, 65536);
		if (len == 0) {
			mtree->this_entry = mtree->entries;
			free_options(global);
			return (ARCHIVE_OK);
		}
		if (len < 0) {
			free_options(global);
			return ((int)len);
		}
		/* Leading whitespace is never significant, ignore it. */
		while (*p == ' ' || *p == '\t') {
			++p;
			--len;
		}
		/* Skip content lines and blank lines. */
		if (*p == '#')
			continue;
		if (*p == '\r' || *p == '\n' || *p == '\0')
			continue;
		if (*p != '/') {
			r = process_add_entry(a, mtree, &global, p, len,
			    &last_entry, is_form_d);
		} else if (strncmp(p, "/set", 4) == 0) {
			if (p[4] != ' ' && p[4] != '\t')
				break;
			r = process_global_set(a, &global, p);
		} else if (strncmp(p, "/unset", 6) == 0) {
			if (p[6] != ' ' && p[6] != '\t')
				break;
			r = process_global_unset(a, &global, p);
		} else
			break;

		if (r != ARCHIVE_OK) {
			free_options(global);
			return r;
		}
	}

	archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
	    "Can't parse line %ju", counter);
	free_options(global);
	return (ARCHIVE_FATAL);
}